

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

bool Imath_2_5::anon_unknown_18::twoSidedJacobiRotation<double>
               (Matrix44<double> *A,int j,int k,Matrix44<double> *U,Matrix44<double> *V,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int l;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double p;
  double dVar13;
  double dVar14;
  double r;
  
  uVar8 = (ulong)(uint)j;
  dVar1 = A->x[j][uVar8];
  uVar9 = (ulong)(uint)k;
  dVar2 = A->x[j][uVar9];
  dVar3 = A->x[k][uVar8];
  dVar4 = A->x[k][uVar9];
  bVar6 = ABS(dVar1 + dVar4) * tol < ABS(dVar2 - dVar3);
  if (bVar6) {
    dVar13 = (dVar1 + dVar4) / (dVar2 - dVar3);
    dVar10 = dVar13 * dVar13 + 1.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar14 = (double)(-(ulong)(dVar13 < 0.0) & (ulong)-(1.0 / dVar10) |
                     ~-(ulong)(dVar13 < 0.0) & (ulong)(1.0 / dVar10));
    dVar13 = dVar13 * dVar14;
    dVar12 = (dVar2 + dVar3) * dVar14 + (dVar4 - dVar1) * dVar13;
    dVar10 = dVar13 * dVar2 - dVar14 * dVar4;
    dVar10 = dVar10 + dVar10;
  }
  else {
    dVar12 = dVar4 - dVar1;
    dVar10 = dVar2 + dVar3;
    dVar13 = 1.0;
    dVar14 = 0.0;
  }
  if (ABS(dVar10) <= ABS(dVar12) * tol) {
    dVar10 = 1.0;
    dVar12 = 0.0;
  }
  else {
    dVar12 = dVar12 / dVar10;
    dVar10 = dVar12 * dVar12 + 1.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar10 = 1.0 / (ABS(dVar12) + dVar10);
    dVar12 = (double)(-(ulong)(dVar12 < 0.0) & (ulong)-dVar10 |
                     ~-(ulong)(dVar12 < 0.0) & (ulong)dVar10);
    dVar10 = dVar12 * dVar12 + 1.0;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar10 = 1.0 / dVar10;
    dVar12 = dVar10 * dVar12;
    bVar6 = true;
  }
  if (bVar6 == false) {
    A->x[k][uVar8] = 0.0;
    A->x[j][uVar9] = 0.0;
  }
  else {
    dVar11 = dVar10 * dVar13 - dVar14 * dVar12;
    dVar14 = dVar13 * dVar12 + dVar14 * dVar10;
    A->x[j][uVar8] =
         (dVar1 * dVar10 - dVar12 * dVar2) * dVar11 - (dVar3 * dVar10 - dVar12 * dVar4) * dVar14;
    A->x[k][uVar9] =
         (dVar1 * dVar12 + dVar2 * dVar10) * dVar14 + (dVar3 * dVar12 + dVar4 * dVar10) * dVar11;
    uVar5 = 0;
    A->x[k][uVar8] = 0.0;
    A->x[j][uVar9] = 0.0;
    do {
      if (uVar9 != uVar5 && uVar8 != uVar5) {
        dVar1 = A->x[j][uVar5];
        dVar2 = A->x[k][uVar5];
        A->x[j][uVar5] = dVar11 * dVar1 + dVar2 * -dVar14;
        A->x[k][uVar5] = dVar1 * dVar14 + dVar2 * dVar11;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
    lVar7 = 0;
    do {
      if (uVar9 << 5 != lVar7 && uVar8 << 5 != lVar7) {
        dVar1 = *(double *)((long)A->x[0] + lVar7 + uVar8 * 8);
        dVar2 = *(double *)((long)A->x[0] + lVar7 + uVar9 * 8);
        *(double *)((long)A->x[0] + lVar7 + uVar8 * 8) = dVar10 * dVar1 + dVar2 * -dVar12;
        *(double *)((long)A->x[0] + lVar7 + uVar9 * 8) = dVar1 * dVar12 + dVar2 * dVar10;
      }
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x80);
    lVar7 = 0;
    do {
      dVar1 = *(double *)((long)U->x[0] + lVar7 + uVar8 * 8);
      dVar2 = *(double *)((long)U->x[0] + lVar7 + uVar9 * 8);
      *(double *)((long)U->x[0] + lVar7 + uVar8 * 8) = dVar11 * dVar1 - dVar14 * dVar2;
      *(double *)((long)U->x[0] + lVar7 + uVar9 * 8) = dVar1 * dVar14 + dVar2 * dVar11;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x80);
    lVar7 = 0;
    do {
      dVar1 = *(double *)((long)V->x[0] + lVar7 + uVar8 * 8);
      dVar2 = *(double *)((long)V->x[0] + lVar7 + uVar9 * 8);
      *(double *)((long)V->x[0] + lVar7 + uVar8 * 8) = dVar10 * dVar1 - dVar12 * dVar2;
      *(double *)((long)V->x[0] + lVar7 + uVar9 * 8) = dVar1 * dVar12 + dVar2 * dVar10;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0x80);
  }
  return bVar6;
}

Assistant:

bool
twoSidedJacobiRotation (IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A,
                        int j,
                        int k,
                        IMATH_INTERNAL_NAMESPACE::Matrix44<T>& U,
                        IMATH_INTERNAL_NAMESPACE::Matrix44<T>& V,
                        const T tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T w = A[j][j];
    const T x = A[j][k];
    const T y = A[k][j];
    const T z = A[k][k];

    // We will keep track of whether we're actually performing any rotations,
    // since if the matrix is already diagonal we'll end up with the identity
    // as our Jacobi rotation and we can short-circuit.
    bool changed = false;

    // The first step is to symmetrize the 2x2 matrix,
    //   [ c  s ]^T [ w x ] = [ p q ]
    //   [ -s c ]   [ y z ]   [ q r ]
    T mu_1 = w + z;
    T mu_2 = x - y;

    T c, s;
    if (std::abs(mu_2) <= tol*std::abs(mu_1))  // Already symmetric (to tolerance)
    {                                          // Note that the <= is important here
        c = T(1);                              // because we want to bypass the computation
        s = T(0);                              // of rho if mu_1 = mu_2 = 0.

        const T p = w;
        const T r = z;
        mu_1 = r - p;
        mu_2 = x + y;
    }
    else
    {
        const T rho = mu_1 / mu_2;
        s = T(1) / std::sqrt (T(1) + rho*rho);  // TODO is there a native inverse square root function?
        if (rho < 0)
            s = -s;
        c = s * rho;

        mu_1 = s * (x + y) + c * (z - w);   // = r - p
        mu_2 = T(2) * (c * x - s * z);      // = 2*q

        changed = true;
    }

    // The second stage diagonalizes,
    //   [ c2   s2 ]^T [ p q ] [ c2  s2 ]  = [ d1   0 ]
    //   [ -s2  c2 ]   [ q r ] [ -s2 c2 ]    [  0  d2 ]
    T c_2, s_2;
    if (std::abs(mu_2) <= tol*std::abs(mu_1))
    {
       c_2 = T(1);
       s_2 = T(0);
    }
    else
    {
        const T rho_2 = mu_1 / mu_2;
        T t_2 = T(1) / (std::abs(rho_2) + std::sqrt(1 + rho_2*rho_2));
        if (rho_2 < 0)
            t_2 = -t_2;
        c_2 = T(1) / std::sqrt (T(1) + t_2*t_2);
        s_2 = c_2 * t_2;

        changed = true;
    }

    const T c_1 = c_2 * c - s_2 * s;
    const T s_1 = s_2 * c + c_2 * s;

    if (!changed)
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[k][j] = 0;
        A[j][k] = 0;
        return false;
    }

    const T d_1 = c_1*(w*c_2 - x*s_2) - s_1*(y*c_2 - z*s_2);
    const T d_2 = s_1*(w*s_2 + x*c_2) + c_1*(y*s_2 + z*c_2);

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.  
    A[j][j] = d_1;
    A[k][k] = d_2;
    A[k][j] = 0;
    A[j][k] = 0;

    // Rotate the entries that _weren't_ involved in the 2x2 SVD:
    for (int l = 0; l < 4; ++l)
    {
        if (l == j || l == k)
            continue;

        // Rotate on the left by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _rows_ to
        // each other.  
        const T tau1 = A[j][l];
        const T tau2 = A[k][l];
        A[j][l] = c_1 * tau1 - s_1 * tau2;
        A[k][l] = s_1 * tau1 + c_1 * tau2;
    }

    for (int l = 0; l < 4; ++l)
    {
        // We set the A[j/k][j/k] entries already
        if (l == j || l == k)
            continue;

        // Rotate on the right by
        //    [ 1               ]
        //    [   .             ]
        //    [     c2   s2     ]  j
        //    [        1        ]
        //    [    -s2   c2     ]  k
        //    [             .   ]
        //    [               1 ]
        //          j    k
        //
        // This has the effect of adding the (weighted) ith and jth _columns_ to
        // each other.  
        const T tau1 = A[l][j];
        const T tau2 = A[l][k];
        A[l][j] = c_2 * tau1 - s_2 * tau2;
        A[l][k] = s_2 * tau1 + c_2 * tau2;
    }

    // Now apply the rotations to U and V:
    // Remember that we have 
    //    R1^T * A * R2 = D
    // This is in the 2x2 case, but after doing a bunch of these
    // we will get something like this for the 3x3 case:
    //   ... R1b^T * R1a^T * A * R2a * R2b * ... = D
    //   -----------------       ---------------
    //        = U^T                    = V
    // So,
    //   U = R1a * R1b * ...
    //   V = R2a * R2b * ...
    jacobiRotateRight (U, j, k, c_1, s_1);
    jacobiRotateRight (V, j, k, c_2, s_2);

    return true;
}